

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

void capnp::_::anon_unknown_129::
     genericCheckTestMessageAllZero<capnproto_test::capnp::test::TestAllTypes::Reader>
               (Reader reader)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ArrayPtr<const_unsigned_char> AVar53;
  int iVar54;
  byte bVar55;
  undefined1 uVar56;
  undefined2 uVar57;
  int iVar58;
  int iVar59;
  _func_int **pp_Var60;
  WirePointer WVar61;
  WirePointer WVar62;
  uint32_t uVar63;
  bool bVar64;
  float fVar65;
  undefined4 uVar66;
  uint uVar67;
  WirePointer WVar68;
  float fVar69;
  _func_int **pp_Var70;
  Reader RVar71;
  Reader RVar72;
  SegmentReader *in_stack_00000008;
  Reader subReader;
  Reader subSubReader;
  undefined1 local_d8 [4];
  undefined1 auStack_d4 [12];
  WirePointer *local_c8;
  StructDataBitCount local_c0;
  BitsPerElementN<23> BStack_bc;
  uint local_b8;
  ushort local_b4;
  ListElementCount local_b0;
  undefined1 local_a8 [4];
  undefined1 auStack_a4 [12];
  WirePointer *local_98;
  StructDataBitCount local_90;
  BitsPerElementN<23> BStack_8c;
  ushort local_84;
  int local_80;
  undefined1 local_78 [8];
  CapTableReader *local_70;
  WirePointer *local_68;
  ListElementCount local_60;
  undefined4 uStack_5c;
  StructPointerCount local_54;
  int local_50;
  undefined1 local_48 [8];
  CapTableReader *local_40;
  WirePointer *local_38;
  int local_30;
  
  if ((((uint)subReader._reader.pointers != 0) &&
      (((ulong)(subReader._reader.capTable)->_vptr_CapTableReader & 1) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    auVar1[0xf] = 0;
    auVar1._0_15_ = stack0xffffffffffffff29;
    _local_d8 = (ArrayPtr<const_unsigned_char>)(auVar1 << 8);
    if ((uint)subReader._reader.pointers == 0) {
      bVar55 = 0;
    }
    else {
      bVar55 = *(byte *)&(subReader._reader.capTable)->_vptr_CapTableReader & 1;
    }
    local_a8[0] = bVar55;
    kj::_::Debug::log<char_const(&)[52],bool,bool>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1bf,ERROR,
               "\"failed: expected \" \"(false) == (reader.getBoolField())\", false, reader.getBoolField()"
               ,(char (*) [52])"failed: expected (false) == (reader.getBoolField())",
               (bool *)local_d8,(bool *)local_a8);
  }
  if ((uint)subReader._reader.pointers < 0x10) {
    bVar64 = false;
  }
  else {
    bVar64 = *(char *)((long)&(subReader._reader.capTable)->_vptr_CapTableReader + 1) != '\0';
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    auVar2._12_4_ = 0;
    auVar2._0_12_ = auStack_d4;
    _local_d8 = (ArrayPtr<const_unsigned_char>)(auVar2 << 0x20);
    if ((uint)subReader._reader.pointers < 0x10) {
      uVar56 = 0;
    }
    else {
      uVar56 = *(undefined1 *)((long)&(subReader._reader.capTable)->_vptr_CapTableReader + 1);
    }
    local_a8[0] = uVar56;
    kj::_::Debug::log<char_const(&)[48],int,signed_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c0,ERROR,
               "\"failed: expected \" \"(0) == (reader.getInt8Field())\", 0, reader.getInt8Field()",
               (char (*) [48])"failed: expected (0) == (reader.getInt8Field())",(int *)local_d8,
               local_a8);
  }
  if ((uint)subReader._reader.pointers < 0x20) {
    bVar64 = false;
  }
  else {
    bVar64 = *(short *)((long)&(subReader._reader.capTable)->_vptr_CapTableReader + 2) != 0;
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    auVar3._12_4_ = 0;
    auVar3._0_12_ = auStack_d4;
    _local_d8 = (ArrayPtr<const_unsigned_char>)(auVar3 << 0x20);
    if ((uint)subReader._reader.pointers < 0x20) {
      uVar57 = 0;
    }
    else {
      uVar57 = *(undefined2 *)((long)&(subReader._reader.capTable)->_vptr_CapTableReader + 2);
    }
    local_a8._0_2_ = uVar57;
    kj::_::Debug::log<char_const(&)[49],int,short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c1,ERROR,
               "\"failed: expected \" \"(0) == (reader.getInt16Field())\", 0, reader.getInt16Field()"
               ,(char (*) [49])"failed: expected (0) == (reader.getInt16Field())",(int *)local_d8,
               (short *)local_a8);
  }
  if ((uint)subReader._reader.pointers < 0x40) {
    bVar64 = false;
  }
  else {
    bVar64 = *(int *)((long)&(subReader._reader.capTable)->_vptr_CapTableReader + 4) != 0;
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    uVar66 = 0;
    auVar4._12_4_ = 0;
    auVar4._0_12_ = auStack_d4;
    _local_d8 = (ArrayPtr<const_unsigned_char>)(auVar4 << 0x20);
    if (0x3f < (uint)subReader._reader.pointers) {
      uVar66 = *(undefined4 *)((long)&(subReader._reader.capTable)->_vptr_CapTableReader + 4);
    }
    local_a8 = (undefined1  [4])uVar66;
    kj::_::Debug::log<char_const(&)[49],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c2,ERROR,
               "\"failed: expected \" \"(0) == (reader.getInt32Field())\", 0, reader.getInt32Field()"
               ,(char (*) [49])"failed: expected (0) == (reader.getInt32Field())",(int *)local_d8,
               (int *)local_a8);
  }
  if ((uint)subReader._reader.pointers < 0x80) {
    bVar64 = false;
  }
  else {
    bVar64 = subReader._reader.capTable[1]._vptr_CapTableReader != (_func_int **)0x0;
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    auVar5._12_4_ = 0;
    auVar5._0_12_ = auStack_a4;
    _local_a8 = (ArrayPtr<const_unsigned_char>)(auVar5 << 0x20);
    if ((uint)subReader._reader.pointers < 0x80) {
      pp_Var60 = (_func_int **)0x0;
    }
    else {
      pp_Var60 = subReader._reader.capTable[1]._vptr_CapTableReader;
    }
    _local_d8 = (SegmentReader *)pp_Var60;
    kj::_::Debug::log<char_const(&)[49],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c3,ERROR,
               "\"failed: expected \" \"(0) == (reader.getInt64Field())\", 0, reader.getInt64Field()"
               ,(char (*) [49])"failed: expected (0) == (reader.getInt64Field())",(int *)local_a8,
               (long *)local_d8);
  }
  if ((uint)subReader._reader.pointers < 0x88) {
    bVar64 = false;
  }
  else {
    bVar64 = *(char *)&subReader._reader.capTable[2]._vptr_CapTableReader != '\0';
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    auVar6._12_4_ = 0;
    auVar6._0_12_ = auStack_d4;
    _local_d8 = (ArrayPtr<const_unsigned_char>)(auVar6 << 0x20);
    if ((uint)subReader._reader.pointers < 0x88) {
      uVar56 = 0;
    }
    else {
      uVar56 = *(undefined1 *)&subReader._reader.capTable[2]._vptr_CapTableReader;
    }
    local_a8[0] = uVar56;
    kj::_::Debug::log<char_const(&)[50],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c4,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt8Field())\", 0u, reader.getUInt8Field()"
               ,(char (*) [50])"failed: expected (0u) == (reader.getUInt8Field())",(uint *)local_d8,
               local_a8);
  }
  if ((uint)subReader._reader.pointers < 0xa0) {
    bVar64 = false;
  }
  else {
    bVar64 = *(short *)((long)&subReader._reader.capTable[2]._vptr_CapTableReader + 2) != 0;
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    auVar7._12_4_ = 0;
    auVar7._0_12_ = auStack_d4;
    _local_d8 = (ArrayPtr<const_unsigned_char>)(auVar7 << 0x20);
    if ((uint)subReader._reader.pointers < 0xa0) {
      uVar57 = 0;
    }
    else {
      uVar57 = *(undefined2 *)((long)&subReader._reader.capTable[2]._vptr_CapTableReader + 2);
    }
    local_a8._0_2_ = uVar57;
    kj::_::Debug::log<char_const(&)[51],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c5,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt16Field())\", 0u, reader.getUInt16Field()"
               ,(char (*) [51])"failed: expected (0u) == (reader.getUInt16Field())",(uint *)local_d8
               ,(unsigned_short *)local_a8);
  }
  if ((uint)subReader._reader.pointers < 0xc0) {
    bVar64 = false;
  }
  else {
    bVar64 = *(int *)((long)&subReader._reader.capTable[2]._vptr_CapTableReader + 4) != 0;
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    uVar66 = 0;
    auVar8._12_4_ = 0;
    auVar8._0_12_ = auStack_d4;
    _local_d8 = (ArrayPtr<const_unsigned_char>)(auVar8 << 0x20);
    if (0xbf < (uint)subReader._reader.pointers) {
      uVar66 = *(undefined4 *)((long)&subReader._reader.capTable[2]._vptr_CapTableReader + 4);
    }
    local_a8 = (undefined1  [4])uVar66;
    kj::_::Debug::log<char_const(&)[51],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c6,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt32Field())\", 0u, reader.getUInt32Field()"
               ,(char (*) [51])"failed: expected (0u) == (reader.getUInt32Field())",(uint *)local_d8
               ,(uint *)local_a8);
  }
  if ((uint)subReader._reader.pointers < 0x100) {
    bVar64 = false;
  }
  else {
    bVar64 = subReader._reader.capTable[3]._vptr_CapTableReader != (_func_int **)0x0;
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    auVar9._12_4_ = 0;
    auVar9._0_12_ = auStack_a4;
    _local_a8 = (ArrayPtr<const_unsigned_char>)(auVar9 << 0x20);
    if ((uint)subReader._reader.pointers < 0x100) {
      pp_Var60 = (_func_int **)0x0;
    }
    else {
      pp_Var60 = subReader._reader.capTable[3]._vptr_CapTableReader;
    }
    _local_d8 = (SegmentReader *)pp_Var60;
    kj::_::Debug::log<char_const(&)[51],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c7,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt64Field())\", 0u, reader.getUInt64Field()"
               ,(char (*) [51])"failed: expected (0u) == (reader.getUInt64Field())",(uint *)local_a8
               ,(unsigned_long *)local_d8);
  }
  fVar65 = 0.0;
  if (0x11f < (uint)subReader._reader.pointers) {
    fVar65 = *(float *)&subReader._reader.capTable[4]._vptr_CapTableReader;
  }
  if ((fVar65 != 0.0) || (NAN(fVar65))) {
    fVar69 = -fVar65;
    if (-fVar65 <= fVar65) {
      fVar69 = fVar65;
    }
    if ((fVar69 * 1e-05 <= fVar69) && (kj::_::Debug::minSeverity < 3)) {
      uVar66 = 0;
      if (0x11f < (uint)subReader._reader.pointers) {
        uVar66 = *(undefined4 *)&subReader._reader.capTable[4]._vptr_CapTableReader;
      }
      local_d8 = (undefined1  [4])uVar66;
      auVar10._12_4_ = 0;
      auVar10._0_12_ = auStack_a4;
      _local_a8 = (ArrayPtr<const_unsigned_char>)(auVar10 << 0x20);
      kj::_::Debug::log<char_const(&)[72],float,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c8,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)\", reader.getFloat32Field(), 0"
                 ,(char (*) [72])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)",
                 (float *)local_d8,(int *)local_a8);
    }
  }
  pp_Var60 = (_func_int **)0x0;
  if (0x17f < (uint)subReader._reader.pointers) {
    pp_Var60 = subReader._reader.capTable[5]._vptr_CapTableReader;
  }
  if (((double)pp_Var60 != 0.0) || (NAN((double)pp_Var60))) {
    pp_Var70 = (_func_int **)-(double)pp_Var60;
    if (-(double)pp_Var60 <= (double)pp_Var60) {
      pp_Var70 = pp_Var60;
    }
    if (((double)pp_Var70 * 1e-12 <= (double)pp_Var70) && (kj::_::Debug::minSeverity < 3)) {
      _local_d8 = (SegmentReader *)0x0;
      if (0x17f < (uint)subReader._reader.pointers) {
        _local_d8 = (SegmentReader *)subReader._reader.capTable[5]._vptr_CapTableReader;
      }
      auVar11._12_4_ = 0;
      auVar11._0_12_ = auStack_a4;
      _local_a8 = (ArrayPtr<const_unsigned_char>)(auVar11 << 0x20);
      kj::_::Debug::log<char_const(&)[73],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c9,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)\", reader.getFloat64Field(), 0"
                 ,(char (*) [73])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)",
                 (double *)local_d8,(int *)local_a8);
    }
  }
  auStack_d4._4_8_ = subReader._reader.segment;
  local_c8 = (WirePointer *)subReader._reader.data;
  _local_d8 = in_stack_00000008;
  local_c0 = subReader._reader.dataSize;
  if (subReader._reader.pointers._4_2_ == 0) {
    auStack_d4._4_8_ = (SegmentReader *)0x0;
    local_c8 = (WirePointer *)0x0;
    _local_d8 = (SegmentReader *)0x0;
    local_c0 = 0x7fffffff;
  }
  RVar71 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_d8,(void *)0x0,0);
  if (((RVar71.super_StringPtr.content.size_ != 1) ||
      (iVar58 = bcmp(RVar71.super_StringPtr.content.ptr,"",0), iVar58 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    auStack_d4._4_8_ = subReader._reader.segment;
    local_c8 = (WirePointer *)subReader._reader.data;
    _local_d8 = in_stack_00000008;
    local_c0 = subReader._reader.dataSize;
    if (subReader._reader.pointers._4_2_ == 0) {
      auStack_d4._4_8_ = (SegmentReader *)0x0;
      local_c8 = (WirePointer *)0x0;
      _local_d8 = (SegmentReader *)0x0;
      local_c0 = 0x7fffffff;
    }
    _local_d8 = (ArrayPtr<const_unsigned_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_d8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[1],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ca,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (reader.getTextField())\", \"\", reader.getTextField()"
               ,(char (*) [49])"failed: expected (\"\") == (reader.getTextField())",
               (char (*) [1])0x515344,(Reader *)local_d8);
  }
  if (subReader._reader.pointers._4_2_ < 2) {
    local_c0 = 0x7fffffff;
    auStack_d4._4_8_ = (SegmentReader *)0x0;
    local_c8 = (WirePointer *)0x0;
    _local_d8 = (SegmentReader *)0x0;
  }
  else {
    local_c8 = (WirePointer *)((long)subReader._reader.data + 8);
    auStack_d4._4_8_ = subReader._reader.segment;
    _local_d8 = in_stack_00000008;
    local_c0 = subReader._reader.dataSize;
  }
  RVar72 = PointerReader::getBlob<capnp::Data>((PointerReader *)local_d8,(void *)0x0,0);
  if ((RVar72.super_ArrayPtr<const_unsigned_char>.size_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    _local_a8 = (ArrayPtr<const_unsigned_char>)ZEXT816(0x515344);
    if (subReader._reader.pointers._4_2_ < 2) {
      local_c0 = 0x7fffffff;
      auStack_d4._4_8_ = (SegmentReader *)0x0;
      local_c8 = (WirePointer *)0x0;
      _local_d8 = (SegmentReader *)0x0;
    }
    else {
      local_c8 = (WirePointer *)((long)subReader._reader.data + 8);
      auStack_d4._4_8_ = subReader._reader.segment;
      _local_d8 = in_stack_00000008;
      local_c0 = subReader._reader.dataSize;
    }
    _local_d8 = (ArrayPtr<const_unsigned_char>)
                PointerReader::getBlob<capnp::Data>((PointerReader *)local_d8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[55],capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1cb,ERROR,
               "\"failed: expected \" \"(data(\\\"\\\")) == (reader.getDataField())\", data(\"\"), reader.getDataField()"
               ,(char (*) [55])"failed: expected (data(\"\")) == (reader.getDataField())",
               (Reader *)local_a8,(Reader *)local_d8);
  }
  if (subReader._reader.pointers._4_2_ < 3) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x10);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getStruct((StructReader *)local_d8,(PointerReader *)local_a8,(word *)0x0);
  if (((local_b8 != 0) && (((local_c8->offsetAndKind).value & 1) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    auVar12[0xf] = 0;
    auVar12._0_15_ = stack0xffffffffffffff59;
    _local_a8 = (ArrayPtr<const_unsigned_char>)(auVar12 << 8);
    if (local_b8 == 0) {
      bVar55 = 0;
    }
    else {
      bVar55 = (byte)(local_c8->offsetAndKind).value & 1;
    }
    local_78[0] = bVar55;
    kj::_::Debug::log<char_const(&)[55],bool,bool>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1cf,ERROR,
               "\"failed: expected \" \"(false) == (subReader.getBoolField())\", false, subReader.getBoolField()"
               ,(char (*) [55])"failed: expected (false) == (subReader.getBoolField())",
               (bool *)local_a8,(bool *)local_78);
  }
  if (local_b8 < 0x10) {
    bVar64 = false;
  }
  else {
    bVar64 = *(char *)((long)&(local_c8->offsetAndKind).value + 1) != '\0';
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    auVar13._12_4_ = 0;
    auVar13._0_12_ = auStack_a4;
    _local_a8 = (ArrayPtr<const_unsigned_char>)(auVar13 << 0x20);
    if (local_b8 < 0x10) {
      uVar56 = 0;
    }
    else {
      uVar56 = *(undefined1 *)((long)&(local_c8->offsetAndKind).value + 1);
    }
    local_78[0] = uVar56;
    kj::_::Debug::log<char_const(&)[51],int,signed_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d0,ERROR,
               "\"failed: expected \" \"(0) == (subReader.getInt8Field())\", 0, subReader.getInt8Field()"
               ,(char (*) [51])"failed: expected (0) == (subReader.getInt8Field())",(int *)local_a8,
               local_78);
  }
  if (local_b8 < 0x20) {
    bVar64 = false;
  }
  else {
    bVar64 = *(short *)((long)&(local_c8->offsetAndKind).value + 2) != 0;
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    auVar14._12_4_ = 0;
    auVar14._0_12_ = auStack_a4;
    _local_a8 = (ArrayPtr<const_unsigned_char>)(auVar14 << 0x20);
    if (local_b8 < 0x20) {
      uVar57 = 0;
    }
    else {
      uVar57 = *(undefined2 *)((long)&(local_c8->offsetAndKind).value + 2);
    }
    local_78._0_2_ = uVar57;
    kj::_::Debug::log<char_const(&)[52],int,short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d1,ERROR,
               "\"failed: expected \" \"(0) == (subReader.getInt16Field())\", 0, subReader.getInt16Field()"
               ,(char (*) [52])"failed: expected (0) == (subReader.getInt16Field())",(int *)local_a8
               ,(short *)local_78);
  }
  if (local_b8 < 0x40) {
    bVar64 = false;
  }
  else {
    bVar64 = (local_c8->field_1).upper32Bits != 0;
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    uVar63 = 0;
    auVar15._12_4_ = 0;
    auVar15._0_12_ = auStack_a4;
    _local_a8 = (ArrayPtr<const_unsigned_char>)(auVar15 << 0x20);
    if (0x3f < local_b8) {
      uVar63 = (local_c8->field_1).upper32Bits;
    }
    local_78._0_4_ = uVar63;
    kj::_::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d2,ERROR,
               "\"failed: expected \" \"(0) == (subReader.getInt32Field())\", 0, subReader.getInt32Field()"
               ,(char (*) [52])"failed: expected (0) == (subReader.getInt32Field())",(int *)local_a8
               ,(int *)local_78);
  }
  if (local_b8 < 0x80) {
    bVar64 = false;
  }
  else {
    bVar64 = local_c8[1] != (WirePointer)0x0;
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    auVar16._12_4_ = 0;
    auVar16._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar16 << 0x20);
    if (local_b8 < 0x80) {
      WVar61.offsetAndKind.value = 0;
      WVar61.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      WVar61 = local_c8[1];
    }
    _local_a8 = WVar61;
    kj::_::Debug::log<char_const(&)[52],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d3,ERROR,
               "\"failed: expected \" \"(0) == (subReader.getInt64Field())\", 0, subReader.getInt64Field()"
               ,(char (*) [52])"failed: expected (0) == (subReader.getInt64Field())",(int *)local_78
               ,(long *)local_a8);
  }
  if (local_b8 < 0x88) {
    bVar64 = false;
  }
  else {
    bVar64 = (char)local_c8[2].offsetAndKind.value != '\0';
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    auVar17._12_4_ = 0;
    auVar17._0_12_ = auStack_a4;
    _local_a8 = (ArrayPtr<const_unsigned_char>)(auVar17 << 0x20);
    if (local_b8 < 0x88) {
      uVar56 = 0;
    }
    else {
      uVar56 = (undefined1)local_c8[2].offsetAndKind.value;
    }
    local_78[0] = uVar56;
    kj::_::Debug::log<char_const(&)[53],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d4,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt8Field())\", 0u, subReader.getUInt8Field()"
               ,(char (*) [53])"failed: expected (0u) == (subReader.getUInt8Field())",
               (uint *)local_a8,local_78);
  }
  if (local_b8 < 0xa0) {
    bVar64 = false;
  }
  else {
    bVar64 = *(short *)((long)&local_c8[2].offsetAndKind.value + 2) != 0;
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    auVar18._12_4_ = 0;
    auVar18._0_12_ = auStack_a4;
    _local_a8 = (ArrayPtr<const_unsigned_char>)(auVar18 << 0x20);
    if (local_b8 < 0xa0) {
      uVar57 = 0;
    }
    else {
      uVar57 = *(undefined2 *)((long)&local_c8[2].offsetAndKind.value + 2);
    }
    local_78._0_2_ = uVar57;
    kj::_::Debug::log<char_const(&)[54],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d5,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt16Field())\", 0u, subReader.getUInt16Field()"
               ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt16Field())",
               (uint *)local_a8,(unsigned_short *)local_78);
  }
  if (local_b8 < 0xc0) {
    bVar64 = false;
  }
  else {
    bVar64 = local_c8[2].field_1.upper32Bits != 0;
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    uVar63 = 0;
    auVar19._12_4_ = 0;
    auVar19._0_12_ = auStack_a4;
    _local_a8 = (ArrayPtr<const_unsigned_char>)(auVar19 << 0x20);
    if (0xbf < local_b8) {
      uVar63 = local_c8[2].field_1.upper32Bits;
    }
    local_78._0_4_ = uVar63;
    kj::_::Debug::log<char_const(&)[54],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d6,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt32Field())\", 0u, subReader.getUInt32Field()"
               ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt32Field())",
               (uint *)local_a8,(uint *)local_78);
  }
  if (local_b8 < 0x100) {
    bVar64 = false;
  }
  else {
    bVar64 = local_c8[3] != (WirePointer)0x0;
  }
  if ((bVar64) && (kj::_::Debug::minSeverity < 3)) {
    auVar20._12_4_ = 0;
    auVar20._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar20 << 0x20);
    if (local_b8 < 0x100) {
      WVar62.offsetAndKind.value = 0;
      WVar62.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      WVar62 = local_c8[3];
    }
    _local_a8 = WVar62;
    kj::_::Debug::log<char_const(&)[54],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d7,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt64Field())\", 0u, subReader.getUInt64Field()"
               ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt64Field())",
               (uint *)local_78,(unsigned_long *)local_a8);
  }
  fVar65 = 0.0;
  if (0x11f < local_b8) {
    fVar65 = (float)local_c8[4].offsetAndKind.value;
  }
  if ((fVar65 != 0.0) || (NAN(fVar65))) {
    fVar69 = -fVar65;
    if (-fVar65 <= fVar65) {
      fVar69 = fVar65;
    }
    if ((fVar69 * 1e-05 <= fVar69) && (kj::_::Debug::minSeverity < 3)) {
      uVar67 = 0;
      if (0x11f < local_b8) {
        uVar67 = local_c8[4].offsetAndKind.value;
      }
      local_a8 = (undefined1  [4])uVar67;
      auVar21._12_4_ = 0;
      auVar21._0_12_ = stack0xffffffffffffff8c;
      _local_78 = (ArrayPtr<const_unsigned_char>)(auVar21 << 0x20);
      kj::_::Debug::log<char_const(&)[75],float,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d8,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)\", subReader.getFloat32Field(), 0"
                 ,(char (*) [75])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)",
                 (float *)local_a8,(int *)local_78);
    }
  }
  WVar68.offsetAndKind.value = 0;
  WVar68.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  if (0x17f < local_b8) {
    WVar68 = local_c8[5];
  }
  if (((double)WVar68 != 0.0) || (NAN((double)WVar68))) {
    WVar61 = (WirePointer)-(double)WVar68;
    if (-(double)WVar68 <= (double)WVar68) {
      WVar61 = WVar68;
    }
    if (((double)WVar61 * 1e-12 <= (double)WVar61) && (kj::_::Debug::minSeverity < 3)) {
      local_a8 = (undefined1  [4])0x0;
      register0x00001204 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      if (0x17f < local_b8) {
        _local_a8 = local_c8[5];
      }
      auVar22._12_4_ = 0;
      auVar22._0_12_ = stack0xffffffffffffff8c;
      _local_78 = (ArrayPtr<const_unsigned_char>)(auVar22 << 0x20);
      kj::_::Debug::log<char_const(&)[76],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d9,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)\", subReader.getFloat64Field(), 0"
                 ,(char (*) [76])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)",
                 (double *)local_a8,(int *)local_78);
    }
  }
  if (local_b4 == 0) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (CapTableReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)CONCAT44(BStack_bc,local_c0);
    auStack_a4._4_8_ = auStack_d4._4_8_;
    _local_a8 = (WirePointer)_local_d8;
    local_90 = local_b0;
  }
  RVar71 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_a8,(void *)0x0,0);
  AVar53 = _local_d8;
  if (((RVar71.super_StringPtr.content.size_ != 1) ||
      (iVar58 = bcmp(RVar71.super_StringPtr.content.ptr,"",0), AVar53 = _local_d8, iVar58 != 0)) &&
     (_local_d8 = AVar53, kj::_::Debug::minSeverity < 3)) {
    if (local_b4 == 0) {
      local_90 = 0x7fffffff;
      auStack_d4._4_8_ = (CapTableReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_d8 = (SegmentReader *)0x0;
    }
    else {
      _local_d8 = (SegmentReader *)AVar53.ptr;
      auStack_d4._4_8_ = AVar53.size_;
      local_98 = (WirePointer *)CONCAT44(BStack_bc,local_c0);
      local_90 = local_b0;
    }
    auStack_a4._4_8_ = auStack_d4._4_8_;
    _local_a8 = (WirePointer)_local_d8;
    _local_a8 = (ArrayPtr<const_unsigned_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_a8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[52],char_const(&)[1],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1da,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (subReader.getTextField())\", \"\", subReader.getTextField()"
               ,(char (*) [52])"failed: expected (\"\") == (subReader.getTextField())",
               (char (*) [1])0x515344,(Reader *)local_a8);
  }
  if (local_b4 < 2) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (CapTableReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 8);
    auStack_a4._4_8_ = auStack_d4._4_8_;
    _local_a8 = (WirePointer)_local_d8;
    local_90 = local_b0;
  }
  RVar72 = PointerReader::getBlob<capnp::Data>((PointerReader *)local_a8,(void *)0x0,0);
  if ((RVar72.super_ArrayPtr<const_unsigned_char>.size_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    _local_78 = (ArrayPtr<const_unsigned_char>)ZEXT816(0x515344);
    if (local_b4 < 2) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (CapTableReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 8);
      auStack_a4._4_8_ = auStack_d4._4_8_;
      _local_a8 = (WirePointer)_local_d8;
      local_90 = local_b0;
    }
    _local_a8 = (ArrayPtr<const_unsigned_char>)
                PointerReader::getBlob<capnp::Data>((PointerReader *)local_a8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[58],capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1db,ERROR,
               "\"failed: expected \" \"(data(\\\"\\\")) == (subReader.getDataField())\", data(\"\"), subReader.getDataField()"
               ,(char (*) [58])"failed: expected (data(\"\")) == (subReader.getDataField())",
               (Reader *)local_78,(Reader *)local_a8);
  }
  if (local_b4 < 3) {
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
    local_60 = 0x7fffffff;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x10);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getStruct((StructReader *)local_a8,(PointerReader *)local_78,(word *)0x0);
  local_68 = (WirePointer *)0x0;
  local_78 = (undefined1  [8])(SegmentReader *)0x0;
  local_70 = (CapTableReader *)0x0;
  local_60 = 0x7fffffff;
  if (local_84 != 0) {
    local_68 = (WirePointer *)CONCAT44(BStack_8c,local_90);
    local_78 = (undefined1  [8])_local_a8;
    local_70 = (CapTableReader *)auStack_a4._4_8_;
    local_60 = local_80;
  }
  RVar71 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_78,(void *)0x0,0);
  AVar53 = _local_a8;
  if (((RVar71.super_StringPtr.content.size_ != 1) ||
      (iVar58 = bcmp(RVar71.super_StringPtr.content.ptr,"",0), AVar53 = _local_a8, iVar58 != 0)) &&
     (_local_a8 = AVar53, kj::_::Debug::minSeverity < 3)) {
    if (local_84 == 0) {
      local_60 = 0x7fffffff;
      auStack_a4._4_8_ = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      _local_a8 = (WirePointer)AVar53.ptr;
      auStack_a4._4_8_ = AVar53.size_;
      local_68 = (WirePointer *)CONCAT44(BStack_8c,local_90);
      local_60 = local_80;
    }
    local_70 = (CapTableReader *)auStack_a4._4_8_;
    local_78 = (undefined1  [8])_local_a8;
    _local_78 = (ArrayPtr<const_unsigned_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_78,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[55],char_const(&)[1],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1de,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getTextField())\", \"\", subSubReader.getTextField()"
               ,(char (*) [55])"failed: expected (\"\") == (subSubReader.getTextField())",
               (char (*) [1])0x515344,(Reader *)local_78);
  }
  if (local_84 < 3) {
    local_40 = (CapTableReader *)0x0;
    local_38 = (WirePointer *)0x0;
    local_48 = (undefined1  [8])0x0;
    local_30 = 0x7fffffff;
  }
  else {
    local_38 = (WirePointer *)(CONCAT44(BStack_8c,local_90) + 0x10);
    local_40 = (CapTableReader *)auStack_a4._4_8_;
    local_48 = (undefined1  [8])_local_a8;
    local_30 = local_80;
  }
  PointerReader::getStruct((StructReader *)local_78,(PointerReader *)local_48,(word *)0x0);
  local_38 = (WirePointer *)0x0;
  local_48 = (undefined1  [8])(SegmentReader *)0x0;
  local_40 = (CapTableReader *)0x0;
  local_30 = 0x7fffffff;
  if (local_54 != 0) {
    local_38 = (WirePointer *)CONCAT44(uStack_5c,local_60);
    local_48 = local_78;
    local_40 = local_70;
    local_30 = local_50;
  }
  RVar71 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_48,(void *)0x0,0);
  AVar53 = _local_a8;
  iVar54 = local_80;
  iVar58 = local_30;
  if (((RVar71.super_StringPtr.content.size_ != 1) ||
      (iVar59 = bcmp(RVar71.super_StringPtr.content.ptr,"",0), iVar58 = local_30, AVar53 = _local_a8
      , iVar54 = local_80, iVar59 != 0)) &&
     (local_30 = iVar54, _local_a8 = AVar53, kj::_::Debug::minSeverity < 3)) {
    if (local_84 < 3) {
      auStack_a4._4_8_ = (CapTableReader *)0x0;
      local_38 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
      local_30 = 0x7fffffff;
    }
    else {
      _local_a8 = (WirePointer)AVar53.ptr;
      auStack_a4._4_8_ = AVar53.size_;
      local_38 = (WirePointer *)(CONCAT44(BStack_8c,local_90) + 0x10);
    }
    local_48 = (undefined1  [8])_local_a8;
    local_40 = (CapTableReader *)auStack_a4._4_8_;
    PointerReader::getStruct((StructReader *)local_78,(PointerReader *)local_48,(word *)0x0);
    local_38 = (WirePointer *)0x0;
    local_48 = (undefined1  [8])(SegmentReader *)0x0;
    local_40 = (CapTableReader *)0x0;
    local_30 = 0x7fffffff;
    if (local_54 != 0) {
      local_38 = (WirePointer *)CONCAT44(uStack_5c,local_60);
      local_48 = local_78;
      local_40 = local_70;
      local_30 = local_50;
    }
    _local_48 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_48,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[72],char_const(&)[1],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1df,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getStructField().getTextField())\", \"\", subSubReader.getStructField().getTextField()"
               ,(char (*) [72])
                "failed: expected (\"\") == (subSubReader.getStructField().getTextField())",
               (char (*) [1])0x515344,(Reader *)local_48);
    iVar58 = local_30;
  }
  local_30 = iVar58;
  if (local_b4 < 4) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x18);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,VOID,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar23._12_4_ = 0;
    auVar23._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar23 << 0x20);
    if (local_b4 < 4) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x18);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,VOID,(word *)0x0);
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e2,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getVoidList().size())\", 0u, subReader.getVoidList().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getVoidList().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 5) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x20);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,BIT,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar24._12_4_ = 0;
    auVar24._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar24 << 0x20);
    if (local_b4 < 5) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x20);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,BIT,(word *)0x0);
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e3,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getBoolList().size())\", 0u, subReader.getBoolList().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getBoolList().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 6) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x28);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,BYTE,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar25._12_4_ = 0;
    auVar25._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar25 << 0x20);
    if (local_b4 < 6) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x28);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,BYTE,(word *)0x0);
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e4,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getInt8List().size())\", 0u, subReader.getInt8List().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getInt8List().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 7) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x30);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,TWO_BYTES,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar26._12_4_ = 0;
    auVar26._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar26 << 0x20);
    if (local_b4 < 7) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x30);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,TWO_BYTES,(word *)0x0);
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e5,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getInt16List().size())\", 0u, subReader.getInt16List().size()"
               ,(char (*) [59])"failed: expected (0u) == (subReader.getInt16List().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 8) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x38);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,FOUR_BYTES,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar27._12_4_ = 0;
    auVar27._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar27 << 0x20);
    if (local_b4 < 8) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x38);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,FOUR_BYTES,(word *)0x0);
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e6,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getInt32List().size())\", 0u, subReader.getInt32List().size()"
               ,(char (*) [59])"failed: expected (0u) == (subReader.getInt32List().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 9) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x40);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,EIGHT_BYTES,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar28._12_4_ = 0;
    auVar28._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar28 << 0x20);
    if (local_b4 < 9) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x40);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,EIGHT_BYTES,(word *)0x0)
    ;
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e7,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getInt64List().size())\", 0u, subReader.getInt64List().size()"
               ,(char (*) [59])"failed: expected (0u) == (subReader.getInt64List().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 10) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x48);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,BYTE,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar29._12_4_ = 0;
    auVar29._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar29 << 0x20);
    if (local_b4 < 10) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x48);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,BYTE,(word *)0x0);
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e8,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt8List().size())\", 0u, subReader.getUInt8List().size()"
               ,(char (*) [59])"failed: expected (0u) == (subReader.getUInt8List().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 0xb) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x50);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,TWO_BYTES,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar30._12_4_ = 0;
    auVar30._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar30 << 0x20);
    if (local_b4 < 0xb) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x50);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,TWO_BYTES,(word *)0x0);
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e9,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt16List().size())\", 0u, subReader.getUInt16List().size()"
               ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt16List().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 0xc) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x58);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,FOUR_BYTES,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar31._12_4_ = 0;
    auVar31._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar31 << 0x20);
    if (local_b4 < 0xc) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x58);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,FOUR_BYTES,(word *)0x0);
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ea,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt32List().size())\", 0u, subReader.getUInt32List().size()"
               ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt32List().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 0xd) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x60);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,EIGHT_BYTES,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar32._12_4_ = 0;
    auVar32._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar32 << 0x20);
    if (local_b4 < 0xd) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x60);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,EIGHT_BYTES,(word *)0x0)
    ;
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1eb,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt64List().size())\", 0u, subReader.getUInt64List().size()"
               ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt64List().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 0xe) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x68);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,FOUR_BYTES,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar33._12_4_ = 0;
    auVar33._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar33 << 0x20);
    if (local_b4 < 0xe) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x68);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,FOUR_BYTES,(word *)0x0);
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[61],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ec,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getFloat32List().size())\", 0u, subReader.getFloat32List().size()"
               ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat32List().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 0xf) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x70);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,EIGHT_BYTES,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar34._12_4_ = 0;
    auVar34._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar34 << 0x20);
    if (local_b4 < 0xf) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x70);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,EIGHT_BYTES,(word *)0x0)
    ;
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[61],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ed,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getFloat64List().size())\", 0u, subReader.getFloat64List().size()"
               ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat64List().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 0x10) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x78);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,POINTER,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar35._12_4_ = 0;
    auVar35._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar35 << 0x20);
    if (local_b4 < 0x10) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x78);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,POINTER,(word *)0x0);
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ee,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getTextList().size())\", 0u, subReader.getTextList().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getTextList().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 0x11) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x80);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,POINTER,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar36._12_4_ = 0;
    auVar36._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar36 << 0x20);
    if (local_b4 < 0x11) {
      local_60 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x80);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
      local_60 = local_b0;
    }
    PointerReader::getList((ListReader *)local_a8,(PointerReader *)local_78,POINTER,(word *)0x0);
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ef,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getDataList().size())\", 0u, subReader.getDataList().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getDataList().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (local_b4 < 0x12) {
    local_60 = 0x7fffffff;
    local_70 = (CapTableReader *)0x0;
    local_68 = (WirePointer *)0x0;
    local_78 = (undefined1  [8])0x0;
  }
  else {
    local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x88);
    local_70 = (CapTableReader *)auStack_d4._4_8_;
    local_78 = (undefined1  [8])_local_d8;
    local_60 = local_b0;
  }
  PointerReader::getList
            ((ListReader *)local_a8,(PointerReader *)local_78,INLINE_COMPOSITE,(word *)0x0);
  if ((local_90 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar37._12_4_ = 0;
    auVar37._0_12_ = stack0xffffffffffffffbc;
    _local_48 = (ArrayPtr<const_char>)(auVar37 << 0x20);
    if (local_b4 < 0x12) {
      local_b0 = 0x7fffffff;
      local_70 = (CapTableReader *)0x0;
      local_68 = (WirePointer *)0x0;
      local_78 = (undefined1  [8])0x0;
    }
    else {
      local_68 = (WirePointer *)(CONCAT44(BStack_bc,local_c0) + 0x88);
      local_70 = (CapTableReader *)auStack_d4._4_8_;
      local_78 = (undefined1  [8])_local_d8;
    }
    local_60 = local_b0;
    PointerReader::getList
              ((ListReader *)local_a8,(PointerReader *)local_78,INLINE_COMPOSITE,(word *)0x0);
    local_78._0_4_ = local_90;
    kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f0,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getStructList().size())\", 0u, subReader.getStructList().size()"
               ,(char (*) [60])"failed: expected (0u) == (subReader.getStructList().size())",
               (uint *)local_48,(uint *)local_78);
  }
  if (subReader._reader.pointers._4_2_ < 4) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x18);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,VOID,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar38._12_4_ = 0;
    auVar38._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar38 << 0x20);
    if (subReader._reader.pointers._4_2_ < 4) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x18);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,VOID,(word *)0x0);
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,499,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getVoidList().size())\", 0u, reader.getVoidList().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getVoidList().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 5) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x20);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,BIT,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar39._12_4_ = 0;
    auVar39._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar39 << 0x20);
    if (subReader._reader.pointers._4_2_ < 5) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x20);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,BIT,(word *)0x0);
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,500,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getBoolList().size())\", 0u, reader.getBoolList().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getBoolList().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 6) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x28);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,BYTE,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar40._12_4_ = 0;
    auVar40._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar40 << 0x20);
    if (subReader._reader.pointers._4_2_ < 6) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x28);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,BYTE,(word *)0x0);
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f5,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getInt8List().size())\", 0u, reader.getInt8List().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getInt8List().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 7) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x30);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,TWO_BYTES,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar41._12_4_ = 0;
    auVar41._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar41 << 0x20);
    if (subReader._reader.pointers._4_2_ < 7) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x30);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,TWO_BYTES,(word *)0x0);
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f6,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getInt16List().size())\", 0u, reader.getInt16List().size()"
               ,(char (*) [56])"failed: expected (0u) == (reader.getInt16List().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 8) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x38);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,FOUR_BYTES,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar42._12_4_ = 0;
    auVar42._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar42 << 0x20);
    if (subReader._reader.pointers._4_2_ < 8) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x38);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,FOUR_BYTES,(word *)0x0);
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f7,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getInt32List().size())\", 0u, reader.getInt32List().size()"
               ,(char (*) [56])"failed: expected (0u) == (reader.getInt32List().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 9) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x40);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,EIGHT_BYTES,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar43._12_4_ = 0;
    auVar43._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar43 << 0x20);
    if (subReader._reader.pointers._4_2_ < 9) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x40);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,EIGHT_BYTES,(word *)0x0)
    ;
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f8,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getInt64List().size())\", 0u, reader.getInt64List().size()"
               ,(char (*) [56])"failed: expected (0u) == (reader.getInt64List().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 10) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x48);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,BYTE,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar44._12_4_ = 0;
    auVar44._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar44 << 0x20);
    if (subReader._reader.pointers._4_2_ < 10) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x48);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,BYTE,(word *)0x0);
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f9,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt8List().size())\", 0u, reader.getUInt8List().size()"
               ,(char (*) [56])"failed: expected (0u) == (reader.getUInt8List().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 0xb) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x50);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,TWO_BYTES,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar45._12_4_ = 0;
    auVar45._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar45 << 0x20);
    if (subReader._reader.pointers._4_2_ < 0xb) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x50);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,TWO_BYTES,(word *)0x0);
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fa,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt16List().size())\", 0u, reader.getUInt16List().size()"
               ,(char (*) [57])"failed: expected (0u) == (reader.getUInt16List().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 0xc) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x58);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,FOUR_BYTES,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar46._12_4_ = 0;
    auVar46._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar46 << 0x20);
    if (subReader._reader.pointers._4_2_ < 0xc) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x58);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,FOUR_BYTES,(word *)0x0);
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fb,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt32List().size())\", 0u, reader.getUInt32List().size()"
               ,(char (*) [57])"failed: expected (0u) == (reader.getUInt32List().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 0xd) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x60);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,EIGHT_BYTES,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar47._12_4_ = 0;
    auVar47._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar47 << 0x20);
    if (subReader._reader.pointers._4_2_ < 0xd) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x60);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,EIGHT_BYTES,(word *)0x0)
    ;
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fc,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt64List().size())\", 0u, reader.getUInt64List().size()"
               ,(char (*) [57])"failed: expected (0u) == (reader.getUInt64List().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 0xe) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x68);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,FOUR_BYTES,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar48._12_4_ = 0;
    auVar48._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar48 << 0x20);
    if (subReader._reader.pointers._4_2_ < 0xe) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x68);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,FOUR_BYTES,(word *)0x0);
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fd,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getFloat32List().size())\", 0u, reader.getFloat32List().size()"
               ,(char (*) [58])"failed: expected (0u) == (reader.getFloat32List().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 0xf) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x70);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,EIGHT_BYTES,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar49._12_4_ = 0;
    auVar49._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar49 << 0x20);
    if (subReader._reader.pointers._4_2_ < 0xf) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x70);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,EIGHT_BYTES,(word *)0x0)
    ;
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fe,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getFloat64List().size())\", 0u, reader.getFloat64List().size()"
               ,(char (*) [58])"failed: expected (0u) == (reader.getFloat64List().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 0x10) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x78);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,POINTER,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar50._12_4_ = 0;
    auVar50._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar50 << 0x20);
    if (subReader._reader.pointers._4_2_ < 0x10) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x78);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,POINTER,(word *)0x0);
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ff,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getTextList().size())\", 0u, reader.getTextList().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getTextList().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 0x11) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x80);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,POINTER,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar51._12_4_ = 0;
    auVar51._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar51 << 0x20);
    if (subReader._reader.pointers._4_2_ < 0x11) {
      local_90 = 0x7fffffff;
      auStack_a4._4_8_ = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      _local_a8 = (WirePointer)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x80);
      auStack_a4._4_8_ = subReader._reader.segment;
      _local_a8 = (WirePointer)in_stack_00000008;
      local_90 = subReader._reader.dataSize;
    }
    PointerReader::getList((ListReader *)local_d8,(PointerReader *)local_a8,POINTER,(word *)0x0);
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x200,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getDataList().size())\", 0u, reader.getDataList().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getDataList().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  if (subReader._reader.pointers._4_2_ < 0x12) {
    local_90 = 0x7fffffff;
    auStack_a4._4_8_ = (SegmentReader *)0x0;
    local_98 = (WirePointer *)0x0;
    _local_a8 = (WirePointer)0x0;
  }
  else {
    local_98 = (WirePointer *)((long)subReader._reader.data + 0x88);
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
  }
  PointerReader::getList
            ((ListReader *)local_d8,(PointerReader *)local_a8,INLINE_COMPOSITE,(word *)0x0);
  if ((local_c0 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar52._12_4_ = 0;
    auVar52._0_12_ = stack0xffffffffffffff8c;
    _local_78 = (ArrayPtr<const_unsigned_char>)(auVar52 << 0x20);
    if (subReader._reader.pointers._4_2_ < 0x12) {
      subReader._reader.dataSize = 0x7fffffff;
      subReader._reader.segment = (SegmentReader *)0x0;
      local_98 = (WirePointer *)0x0;
      in_stack_00000008 = (SegmentReader *)0x0;
    }
    else {
      local_98 = (WirePointer *)((long)subReader._reader.data + 0x88);
    }
    auStack_a4._4_8_ = subReader._reader.segment;
    _local_a8 = (WirePointer)in_stack_00000008;
    local_90 = subReader._reader.dataSize;
    PointerReader::getList
              ((ListReader *)local_d8,(PointerReader *)local_a8,INLINE_COMPOSITE,(word *)0x0);
    local_a8 = (undefined1  [4])local_c0;
    kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x201,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getStructList().size())\", 0u, reader.getStructList().size()"
               ,(char (*) [57])"failed: expected (0u) == (reader.getStructList().size())",
               (uint *)local_78,(uint *)local_a8);
  }
  return;
}

Assistant:

void genericCheckTestMessageAllZero(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(false, reader.getBoolField());
  EXPECT_EQ(0, reader.getInt8Field());
  EXPECT_EQ(0, reader.getInt16Field());
  EXPECT_EQ(0, reader.getInt32Field());
  EXPECT_EQ(0, reader.getInt64Field());
  EXPECT_EQ(0u, reader.getUInt8Field());
  EXPECT_EQ(0u, reader.getUInt16Field());
  EXPECT_EQ(0u, reader.getUInt32Field());
  EXPECT_EQ(0u, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(0, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(0, reader.getFloat64Field());
  EXPECT_EQ("", reader.getTextField());
  EXPECT_EQ(data(""), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(false, subReader.getBoolField());
    EXPECT_EQ(0, subReader.getInt8Field());
    EXPECT_EQ(0, subReader.getInt16Field());
    EXPECT_EQ(0, subReader.getInt32Field());
    EXPECT_EQ(0, subReader.getInt64Field());
    EXPECT_EQ(0u, subReader.getUInt8Field());
    EXPECT_EQ(0u, subReader.getUInt16Field());
    EXPECT_EQ(0u, subReader.getUInt32Field());
    EXPECT_EQ(0u, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(0, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(0, subReader.getFloat64Field());
    EXPECT_EQ("", subReader.getTextField());
    EXPECT_EQ(data(""), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("", subSubReader.getTextField());
      EXPECT_EQ("", subSubReader.getStructField().getTextField());
    }

    EXPECT_EQ(0u, subReader.getVoidList().size());
    EXPECT_EQ(0u, subReader.getBoolList().size());
    EXPECT_EQ(0u, subReader.getInt8List().size());
    EXPECT_EQ(0u, subReader.getInt16List().size());
    EXPECT_EQ(0u, subReader.getInt32List().size());
    EXPECT_EQ(0u, subReader.getInt64List().size());
    EXPECT_EQ(0u, subReader.getUInt8List().size());
    EXPECT_EQ(0u, subReader.getUInt16List().size());
    EXPECT_EQ(0u, subReader.getUInt32List().size());
    EXPECT_EQ(0u, subReader.getUInt64List().size());
    EXPECT_EQ(0u, subReader.getFloat32List().size());
    EXPECT_EQ(0u, subReader.getFloat64List().size());
    EXPECT_EQ(0u, subReader.getTextList().size());
    EXPECT_EQ(0u, subReader.getDataList().size());
    EXPECT_EQ(0u, subReader.getStructList().size());
  }

  EXPECT_EQ(0u, reader.getVoidList().size());
  EXPECT_EQ(0u, reader.getBoolList().size());
  EXPECT_EQ(0u, reader.getInt8List().size());
  EXPECT_EQ(0u, reader.getInt16List().size());
  EXPECT_EQ(0u, reader.getInt32List().size());
  EXPECT_EQ(0u, reader.getInt64List().size());
  EXPECT_EQ(0u, reader.getUInt8List().size());
  EXPECT_EQ(0u, reader.getUInt16List().size());
  EXPECT_EQ(0u, reader.getUInt32List().size());
  EXPECT_EQ(0u, reader.getUInt64List().size());
  EXPECT_EQ(0u, reader.getFloat32List().size());
  EXPECT_EQ(0u, reader.getFloat64List().size());
  EXPECT_EQ(0u, reader.getTextList().size());
  EXPECT_EQ(0u, reader.getDataList().size());
  EXPECT_EQ(0u, reader.getStructList().size());
}